

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O1

ValueType * __thiscall
HighsHashTable<int,_std::pair<double,_int>_>::operator[]
          (HighsHashTable<int,_std::pair<double,_int>_> *this,KeyType_conflict *key)

{
  double dVar1;
  uchar uVar2;
  KeyType_conflict KVar3;
  int iVar4;
  _Head_base<0UL,_HighsHashTableEntry<int,_std::pair<double,_int>_>_*,_false> _Var5;
  uchar *puVar6;
  undefined8 uVar7;
  bool bVar8;
  ValueType *pVVar9;
  ulong uVar10;
  u8 meta;
  u64 pos;
  Entry entry;
  u64 maxPos;
  u64 startPos;
  uchar local_49;
  ulong local_48;
  HighsHashTableEntry<int,_std::pair<double,_int>_> local_40;
  ulong local_28;
  ulong local_20;
  
  _Var5._M_head_impl =
       (this->entries)._M_t.
       super___uniq_ptr_impl<HighsHashTableEntry<int,_std::pair<double,_int>_>,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
       ._M_t.
       super__Tuple_impl<0UL,_HighsHashTableEntry<int,_std::pair<double,_int>_>_*,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
       .super__Head_base<0UL,_HighsHashTableEntry<int,_std::pair<double,_int>_>_*,_false>.
       _M_head_impl;
  bVar8 = findPosition(this,key,&local_49,&local_20,&local_28,&local_48);
  if (bVar8) {
    pVVar9 = (ValueType *)((long)(_Var5._M_head_impl + local_48) + 8);
  }
  else {
    if ((this->numElements == this->tableSizeMask * 7 + 7 >> 3) || (local_48 == local_28)) {
      growTable(this);
    }
    else {
      uVar7 = _Var5._M_head_impl + local_48;
      local_40.key_ = *key;
      local_40.value_.first = 0.0;
      local_40.value_.second = 0;
      this->numElements = this->numElements + 1;
      do {
        puVar6 = (this->metadata)._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
        if (-1 < (char)puVar6[local_48]) {
          puVar6[local_48] = local_49;
          *(ulong *)((long)(_Var5._M_head_impl + local_48) + 0x10) =
               CONCAT44(local_40.value_._12_4_,local_40.value_.second);
          *(ulong *)(_Var5._M_head_impl + local_48) = CONCAT44(local_40._4_4_,local_40.key_);
          _Var5._M_head_impl[local_48].value_.first = local_40.value_.first;
          return (ValueType *)(uVar7 + 8);
        }
        uVar10 = (ulong)((int)local_48 - (uint)puVar6[local_48] & 0x7f);
        if (uVar10 < (local_48 - local_20 & this->tableSizeMask)) {
          KVar3 = _Var5._M_head_impl[local_48].key_;
          dVar1 = *(double *)((long)(_Var5._M_head_impl + local_48) + 8);
          iVar4 = *(int *)((long)(_Var5._M_head_impl + local_48) + 0x10);
          _Var5._M_head_impl[local_48].key_ = local_40.key_;
          *(double *)((long)(_Var5._M_head_impl + local_48) + 8) = local_40.value_.first;
          *(int *)((long)(_Var5._M_head_impl + local_48) + 0x10) = local_40.value_.second;
          uVar2 = puVar6[local_48];
          puVar6[local_48] = local_49;
          local_20 = local_48 - uVar10 & this->tableSizeMask;
          local_28 = local_20 + 0x7f & this->tableSizeMask;
          local_49 = uVar2;
          local_40.key_ = KVar3;
          local_40.value_.first = dVar1;
          local_40.value_.second = iVar4;
        }
        local_48 = local_48 + 1 & this->tableSizeMask;
      } while (local_48 != local_28);
      growTable(this);
      HighsHashTable<int,std::pair<double,int>>::
      insert<HighsHashTableEntry<int,std::pair<double,int>>>
                ((HighsHashTable<int,std::pair<double,int>> *)this,&local_40);
    }
    pVVar9 = operator[](this,key);
  }
  return pVVar9;
}

Assistant:

ValueType& operator[](const KeyType& key) {
    Entry* entryArray = entries.get();
    u64 pos, startPos, maxPos;
    u8 meta;
    if (findPosition(key, meta, startPos, maxPos, pos))
      return entryArray[pos].value();

    if (numElements == ((tableSizeMask + 1) * 7) / 8 || pos == maxPos) {
      growTable();
      return (*this)[key];
    }

    using std::swap;
    ValueType& insertLocation = entryArray[pos].value();
    Entry entry(key);
    ++numElements;

    do {
      if (!occupied(metadata[pos])) {
        metadata[pos] = meta;
        new (&entryArray[pos]) Entry{std::move(entry)};
        return insertLocation;
      }

      u64 currentDistance = (pos - startPos) & tableSizeMask;
      u64 distanceOfCurrentOccupant = distanceFromIdealSlot(pos);
      if (currentDistance > distanceOfCurrentOccupant) {
        // steal the position
        swap(entry, entryArray[pos]);
        swap(meta, metadata[pos]);

        startPos = (pos - distanceOfCurrentOccupant) & tableSizeMask;
        maxPos = (startPos + maxDistance()) & tableSizeMask;
      }
      pos = (pos + 1) & tableSizeMask;
    } while (pos != maxPos);

    growTable();
    insert(std::move(entry));
    return (*this)[key];
  }